

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * sqlite3StrAccumFinish(StrAccum *p)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  
  if (p->zText == (char *)0x0) {
    return (char *)0x0;
  }
  p->zText[p->nChar] = '\0';
  pcVar3 = p->zText;
  if (p->useMalloc == '\0') {
    return pcVar3;
  }
  if (pcVar3 != p->zBase) {
    return pcVar3;
  }
  if (p->useMalloc == '\x01') {
    pcVar3 = (char *)sqlite3DbMallocRaw(p->db,p->nChar + 1);
  }
  else {
    iVar1 = p->nChar;
    iVar2 = sqlite3_initialize();
    if (iVar2 != 0) {
      p->zText = (char *)0x0;
      goto LAB_00148eea;
    }
    pcVar3 = (char *)sqlite3Malloc(iVar1 + 1);
  }
  p->zText = pcVar3;
  if (pcVar3 != (char *)0x0) {
    memcpy(pcVar3,p->zBase,(long)p->nChar + 1);
    return p->zText;
  }
LAB_00148eea:
  p->mallocFailed = '\x01';
  return (char *)0x0;
}

Assistant:

SQLITE_PRIVATE char *sqlite3StrAccumFinish(StrAccum *p){
  if( p->zText ){
    p->zText[p->nChar] = 0;
    if( p->useMalloc && p->zText==p->zBase ){
      if( p->useMalloc==1 ){
        p->zText = sqlite3DbMallocRaw(p->db, p->nChar+1 );
      }else{
        p->zText = sqlite3_malloc(p->nChar+1);
      }
      if( p->zText ){
        memcpy(p->zText, p->zBase, p->nChar+1);
      }else{
        p->mallocFailed = 1;
      }
    }
  }
  return p->zText;
}